

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

ALLEGRO_CONFIG * al_load_config_file_f(ALLEGRO_FILE *file)

{
  _Bool _Var1;
  ALLEGRO_CONFIG *us;
  ALLEGRO_USTR *us_00;
  ALLEGRO_CONFIG *config_00;
  size_t sVar2;
  ALLEGRO_USTR *in_stack_00000010;
  ALLEGRO_FILE *in_stack_00000018;
  int rbracket;
  ALLEGRO_USTR *name;
  ALLEGRO_USTR *value;
  ALLEGRO_USTR *key;
  ALLEGRO_USTR *section;
  ALLEGRO_USTR *line;
  ALLEGRO_CONFIG_SECTION *current_section;
  ALLEGRO_CONFIG *config;
  char *in_stack_ffffffffffffff98;
  ALLEGRO_CONFIG *in_stack_ffffffffffffffa0;
  ALLEGRO_CONFIG *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  ALLEGRO_USTR *in_stack_ffffffffffffffb8;
  ALLEGRO_CONFIG_SECTION *local_20;
  ALLEGRO_CONFIG *local_8;
  
  local_20 = (ALLEGRO_CONFIG_SECTION *)0x0;
  local_8 = al_create_config();
  if (local_8 == (ALLEGRO_CONFIG *)0x0) {
    local_8 = (ALLEGRO_CONFIG *)0x0;
  }
  else {
    us = (ALLEGRO_CONFIG *)al_ustr_new((char *)0x14b92e);
    al_ustr_new((char *)0x14b93f);
    us_00 = al_ustr_new((char *)0x14b950);
    config_00 = (ALLEGRO_CONFIG *)al_ustr_new((char *)0x14b961);
    while( true ) {
      al_ustr_assign_cstr((ALLEGRO_USTR *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      _Var1 = readline(in_stack_00000018,in_stack_00000010);
      if (!_Var1) break;
      al_ustr_trim_ws((ALLEGRO_USTR *)0x14b999);
      _Var1 = al_ustr_has_prefix_cstr
                        ((ALLEGRO_USTR *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (char *)in_stack_ffffffffffffffa8);
      if ((_Var1) || (sVar2 = al_ustr_size((ALLEGRO_USTR *)us), sVar2 == 0)) {
        if (local_20 == (ALLEGRO_CONFIG_SECTION *)0x0) {
          in_stack_ffffffffffffffb8 = al_ustr_empty_string();
        }
        else {
          in_stack_ffffffffffffffb8 = local_20->name;
        }
        config_add_comment((ALLEGRO_CONFIG *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (ALLEGRO_USTR *)in_stack_ffffffffffffffa8,
                           (ALLEGRO_USTR *)in_stack_ffffffffffffffa0);
      }
      else {
        _Var1 = al_ustr_has_prefix_cstr
                          ((ALLEGRO_USTR *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (char *)in_stack_ffffffffffffffa8);
        if (_Var1) {
          in_stack_ffffffffffffffa8 = us;
          al_ustr_size((ALLEGRO_USTR *)us);
          in_stack_ffffffffffffffb4 =
               al_ustr_rfind_chr(us_00,(int)((ulong)config_00 >> 0x20),(int32_t)config_00);
          if (in_stack_ffffffffffffffb4 == -1) {
            sVar2 = al_ustr_size((ALLEGRO_USTR *)us);
            in_stack_ffffffffffffffb4 = (int)sVar2;
          }
          al_ustr_assign_substr
                    ((ALLEGRO_USTR *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (ALLEGRO_USTR *)in_stack_ffffffffffffffa8,
                     (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0)
          ;
          local_20 = config_add_section(in_stack_ffffffffffffffa8,
                                        (ALLEGRO_USTR *)in_stack_ffffffffffffffa0);
        }
        else {
          get_key_and_value((ALLEGRO_USTR *)config_00,in_stack_ffffffffffffffb8,
                            (ALLEGRO_USTR *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (local_20 == (ALLEGRO_CONFIG_SECTION *)0x0) {
            in_stack_ffffffffffffffa0 = local_8;
            al_ustr_empty_string();
            config_set_value(config_00,in_stack_ffffffffffffffb8,
                             (ALLEGRO_USTR *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (ALLEGRO_USTR *)in_stack_ffffffffffffffa8);
          }
          else {
            config_set_value(config_00,in_stack_ffffffffffffffb8,
                             (ALLEGRO_USTR *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (ALLEGRO_USTR *)in_stack_ffffffffffffffa8);
          }
        }
      }
    }
    al_ustr_free((ALLEGRO_USTR *)0x14baee);
    al_ustr_free((ALLEGRO_USTR *)0x14baf8);
    al_ustr_free((ALLEGRO_USTR *)0x14bb02);
    al_ustr_free((ALLEGRO_USTR *)0x14bb0c);
  }
  return local_8;
}

Assistant:

ALLEGRO_CONFIG *al_load_config_file_f(ALLEGRO_FILE *file)
{
   ALLEGRO_CONFIG *config;
   ALLEGRO_CONFIG_SECTION *current_section = NULL;
   ALLEGRO_USTR *line;
   ALLEGRO_USTR *section;
   ALLEGRO_USTR *key;
   ALLEGRO_USTR *value;
   ASSERT(file);

   config = al_create_config();
   if (!config) {
      return NULL;
   }

   line = al_ustr_new("");
   section = al_ustr_new("");
   key = al_ustr_new("");
   value = al_ustr_new("");

   while (1) {
      al_ustr_assign_cstr(line, "");
      if (!readline(file, line))
         break;
      al_ustr_trim_ws(line);

      if (al_ustr_has_prefix_cstr(line, "#") || al_ustr_size(line) == 0) {
         /* Preserve comments and blank lines */
         const ALLEGRO_USTR *name;
         if (current_section)
            name = current_section->name;
         else
            name = al_ustr_empty_string();
         config_add_comment(config, name, line);
      }
      else if (al_ustr_has_prefix_cstr(line, "[")) {
         int rbracket = al_ustr_rfind_chr(line, al_ustr_size(line), ']');
         if (rbracket == -1)
            rbracket = al_ustr_size(line);
         al_ustr_assign_substr(section, line, 1, rbracket);
         current_section = config_add_section(config, section);
      }
      else {
         get_key_and_value(line, key, value);
         if (current_section == NULL)
            config_set_value(config, al_ustr_empty_string(), key, value);
         else
            config_set_value(config, current_section->name, key, value);
      }
   }

   al_ustr_free(line);
   al_ustr_free(section);
   al_ustr_free(key);
   al_ustr_free(value);

   return config;
}